

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool string_parse_kv_override
               (char *data,
               vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *overrides)

{
  char *__s1;
  int iVar1;
  char *pcVar2;
  common_log *log;
  size_t sVar3;
  llama_model_kv_override kvo;
  
  pcVar2 = strchr(data,0x3d);
  if ((pcVar2 == (char *)0x0) || (sVar3 = (long)pcVar2 - (long)data, 0x7f < (long)sVar3)) {
    if (common_log_verbosity_thold < 0) {
      return false;
    }
    log = common_log_main();
    pcVar2 = "%s: malformed KV override \'%s\'\n";
    goto LAB_001d7027;
  }
  strncpy(kvo.key,data,sVar3);
  *(undefined1 *)((long)&kvo + sVar3 + 4) = 0;
  __s1 = pcVar2 + 1;
  iVar1 = strncmp(__s1,"int:",4);
  if (iVar1 == 0) {
    kvo.tag = LLAMA_KV_OVERRIDE_TYPE_INT;
    kvo.field_2.val_i64 = atol(pcVar2 + 5);
  }
  else {
    iVar1 = strncmp(__s1,"float:",6);
    if (iVar1 == 0) {
      kvo.tag = LLAMA_KV_OVERRIDE_TYPE_FLOAT;
      kvo.field_2.val_f64 = atof(pcVar2 + 7);
    }
    else {
      iVar1 = strncmp(__s1,"bool:",5);
      if (iVar1 != 0) {
        iVar1 = strncmp(__s1,"str:",4);
        if (iVar1 == 0) {
          kvo.tag = LLAMA_KV_OVERRIDE_TYPE_STR;
          sVar3 = strlen(pcVar2 + 5);
          if (sVar3 < 0x80) {
            strncpy(kvo.field_2.val_str,pcVar2 + 5,0x7f);
            kvo.field_2.val_str[0x7f] = '\0';
            goto LAB_001d7118;
          }
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar2 = "%s: malformed KV override \'%s\', value cannot exceed 127 chars\n";
        }
        else {
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar2 = "%s: invalid type for KV override \'%s\'\n";
        }
LAB_001d7027:
        common_log_add(log,GGML_LOG_LEVEL_ERROR,pcVar2,"string_parse_kv_override",data);
        return false;
      }
      kvo.tag = LLAMA_KV_OVERRIDE_TYPE_BOOL;
      iVar1 = strcmp(pcVar2 + 6,"true");
      if (iVar1 == 0) {
        kvo.field_2.val_bool = true;
      }
      else {
        iVar1 = strcmp(pcVar2 + 6,"false");
        if (iVar1 != 0) {
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar2 = "%s: invalid boolean value for KV override \'%s\'\n";
          goto LAB_001d7027;
        }
        kvo.field_2.val_i64 = kvo.field_2.val_i64 & 0xffffffffffffff00;
      }
    }
  }
LAB_001d7118:
  std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
  emplace_back<llama_model_kv_override>(overrides,&kvo);
  return true;
}

Assistant:

bool string_parse_kv_override(const char * data, std::vector<llama_model_kv_override> & overrides) {
    const char * sep = strchr(data, '=');
    if (sep == nullptr || sep - data >= 128) {
        LOG_ERR("%s: malformed KV override '%s'\n", __func__, data);
        return false;
    }
    llama_model_kv_override kvo;
    std::strncpy(kvo.key, data, sep - data);
    kvo.key[sep - data] = 0;
    sep++;
    if (strncmp(sep, "int:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_INT;
        kvo.val_i64 = std::atol(sep);
    } else if (strncmp(sep, "float:", 6) == 0) {
        sep += 6;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_FLOAT;
        kvo.val_f64 = std::atof(sep);
    } else if (strncmp(sep, "bool:", 5) == 0) {
        sep += 5;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_BOOL;
        if (std::strcmp(sep, "true") == 0) {
            kvo.val_bool = true;
        } else if (std::strcmp(sep, "false") == 0) {
            kvo.val_bool = false;
        } else {
            LOG_ERR("%s: invalid boolean value for KV override '%s'\n", __func__, data);
            return false;
        }
    } else if (strncmp(sep, "str:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_STR;
        if (strlen(sep) > 127) {
            LOG_ERR("%s: malformed KV override '%s', value cannot exceed 127 chars\n", __func__, data);
            return false;
        }
        strncpy(kvo.val_str, sep, 127);
        kvo.val_str[127] = '\0';
    } else {
        LOG_ERR("%s: invalid type for KV override '%s'\n", __func__, data);
        return false;
    }
    overrides.emplace_back(std::move(kvo));
    return true;
}